

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O0

void __thiscall
yactfr::internal::JsonAnyFragValReqImpl::_addToFragValReqs<yactfr::internal::JsonDtAliasFragValReq>
          (JsonAnyFragValReqImpl *this,JsonDtAliasFragValReq *valReq)

{
  bool bVar1;
  char *pcVar2;
  JsonDtAliasFragValReq *local_80;
  pair<const_char_*,_const_yactfr::internal::JsonDtAliasFragValReq_*> local_78;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_yactfr::internal::JsonValReq_*>,_true>
  local_68 [3];
  allocator local_49;
  key_type local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_yactfr::internal::JsonValReq_*>,_true>
  local_28;
  char *local_20;
  char *typeStr;
  JsonDtAliasFragValReq *valReq_local;
  JsonAnyFragValReqImpl *this_local;
  
  typeStr = (char *)valReq;
  valReq_local = (JsonDtAliasFragValReq *)this;
  pcVar2 = JsonDtAliasFragValReq::typeStr();
  local_20 = pcVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,pcVar2,&local_49);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_yactfr::internal::JsonValReq_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_yactfr::internal::JsonValReq_*>_>_>
       ::find(&this->_fragValReqs,&local_48);
  local_68[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_yactfr::internal::JsonValReq_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_yactfr::internal::JsonValReq_*>_>_>
       ::end(&this->_fragValReqs);
  bVar1 = std::__detail::operator==(&local_28,local_68);
  if (!bVar1) {
    __assert_fail("_fragValReqs.find(typeStr) == _fragValReqs.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/json/ctf-2-json-val-req.cpp"
                  ,0x93c,
                  "void yactfr::internal::JsonAnyFragValReqImpl::_addToFragValReqs(const JsonValReqT &) [JsonValReqT = yactfr::internal::JsonDtAliasFragValReq]"
                 );
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_80 = (JsonDtAliasFragValReq *)typeStr;
  local_78 = std::make_pair<char_const*const&,yactfr::internal::JsonDtAliasFragValReq_const*>
                       (&local_20,&local_80);
  std::
  unordered_map<std::__cxx11::string,yactfr::internal::JsonValReq_const*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonValReq_const*>>>
  ::insert<std::pair<char_const*,yactfr::internal::JsonDtAliasFragValReq_const*>>
            ((unordered_map<std::__cxx11::string,yactfr::internal::JsonValReq_const*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonValReq_const*>>>
              *)&this->_fragValReqs,&local_78);
  return;
}

Assistant:

void _addToFragValReqs(const JsonValReqT& valReq)
    {
        const auto typeStr = JsonValReqT::typeStr();

        assert(_fragValReqs.find(typeStr) == _fragValReqs.end());
        _fragValReqs.insert(std::make_pair(typeStr, &valReq));
    }